

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::costsFirstPartialDerivativeWRTControl
          (OptimalControlProblem *this,double time,VectorDynSize *state,VectorDynSize *control,
          VectorDynSize *partialDerivative)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  char cVar7;
  Index size;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  _Rb_tree_node_base *p_Var12;
  string *psVar13;
  ostream *poVar14;
  ulong uVar15;
  ulong uVar16;
  _Rb_tree_header *p_Var17;
  bool bVar18;
  ostringstream errorMsg;
  long *local_1e0;
  long local_1d0 [2];
  VectorDynSize *local_1c0;
  _Base_ptr local_1b8;
  undefined8 uStack_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = state;
  lVar8 = iDynTree::VectorDynSize::size();
  lVar9 = iDynTree::VectorDynSize::size();
  if (lVar8 != lVar9) {
    iDynTree::VectorDynSize::size();
    iDynTree::VectorDynSize::resize((ulong)partialDerivative);
  }
  p_Var12 = (this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var17 = &(this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var12 != p_Var17) {
    bVar18 = true;
    do {
      bVar6 = TimeRange::isInRange((TimeRange *)&p_Var12[8]._M_left,time);
      if (bVar6) {
        cVar7 = (**(code **)(**(long **)(p_Var12 + 2) + 0x20))
                          (time,*(long **)(p_Var12 + 2),local_1c0,control,&p_Var12[7]._M_parent);
        if (cVar7 == '\0') {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error while evaluating cost ",0x1c);
          psVar13 = Cost::name_abi_cxx11_(*(Cost **)(p_Var12 + 2));
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(psVar13->_M_dataplus)._M_p,
                               psVar13->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,".",1);
          std::__cxx11::stringbuf::str();
          iDynTree::reportError
                    ("OptimalControlProblem","costFirstPartialDerivativeWRTControl",
                     (char *)local_1e0);
LAB_001465c4:
          if (local_1e0 != local_1d0) {
            operator_delete(local_1e0,local_1d0[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
          std::ios_base::~ios_base(local_138);
          return false;
        }
        lVar8 = iDynTree::VectorDynSize::size();
        lVar9 = iDynTree::VectorDynSize::size();
        if (lVar8 != lVar9) {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error while evaluating ",0x17);
          psVar13 = Cost::name_abi_cxx11_(*(Cost **)(p_Var12 + 2));
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(psVar13->_M_dataplus)._M_p,
                               psVar13->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,": ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar14,"the jacobian size is expected to match the control dimension.",0x3d);
          std::__cxx11::stringbuf::str();
          iDynTree::reportError
                    ("OptimalControlProblem","costFirstPartialDerivativeWRTControl",
                     (char *)local_1e0);
          goto LAB_001465c4;
        }
        lVar8 = iDynTree::VectorDynSize::data();
        iDynTree::VectorDynSize::size();
        local_1b8 = p_Var12[8]._M_parent;
        uStack_1b0 = 0;
        uVar10 = iDynTree::VectorDynSize::data();
        uVar11 = iDynTree::VectorDynSize::size();
        if (bVar18) {
          uVar15 = uVar11;
          if (((uVar10 & 7) == 0) &&
             (uVar15 = (ulong)((uint)(uVar10 >> 3) & 1), (long)uVar11 <= (long)uVar15)) {
            uVar15 = uVar11;
          }
          if (0 < (long)uVar15) {
            uVar16 = 0;
            do {
              *(double *)(uVar10 + uVar16 * 8) = *(double *)(lVar8 + uVar16 * 8) * (double)local_1b8
              ;
              uVar16 = uVar16 + 1;
            } while (uVar15 != uVar16);
          }
          lVar9 = uVar11 - uVar15;
          uVar16 = (lVar9 - (lVar9 >> 0x3f) & 0xfffffffffffffffeU) + uVar15;
          if (1 < lVar9) {
            do {
              pdVar1 = (double *)(lVar8 + uVar15 * 8);
              dVar4 = pdVar1[1];
              pdVar2 = (double *)(uVar10 + uVar15 * 8);
              *pdVar2 = *pdVar1 * (double)local_1b8;
              pdVar2[1] = dVar4 * (double)local_1b8;
              uVar15 = uVar15 + 2;
            } while ((long)uVar15 < (long)uVar16);
          }
          if ((long)uVar16 < (long)uVar11) {
            do {
              *(double *)(uVar10 + uVar16 * 8) = *(double *)(lVar8 + uVar16 * 8) * (double)local_1b8
              ;
              uVar16 = uVar16 + 1;
            } while (uVar11 != uVar16);
          }
        }
        else {
          uVar15 = uVar11;
          if (((uVar10 & 7) == 0) &&
             (uVar15 = (ulong)((uint)(uVar10 >> 3) & 1), (long)uVar11 <= (long)uVar15)) {
            uVar15 = uVar11;
          }
          if (0 < (long)uVar15) {
            uVar16 = 0;
            do {
              *(double *)(uVar10 + uVar16 * 8) =
                   *(double *)(lVar8 + uVar16 * 8) * (double)local_1b8 +
                   *(double *)(uVar10 + uVar16 * 8);
              uVar16 = uVar16 + 1;
            } while (uVar15 != uVar16);
          }
          lVar9 = uVar11 - uVar15;
          uVar16 = (lVar9 - (lVar9 >> 0x3f) & 0xfffffffffffffffeU) + uVar15;
          if (1 < lVar9) {
            do {
              pdVar1 = (double *)(lVar8 + uVar15 * 8);
              dVar5 = pdVar1[1];
              pdVar2 = (double *)(uVar10 + uVar15 * 8);
              dVar4 = pdVar2[1];
              pdVar3 = (double *)(uVar10 + uVar15 * 8);
              *pdVar3 = *pdVar1 * (double)local_1b8 + *pdVar2;
              pdVar3[1] = dVar5 * (double)local_1b8 + dVar4;
              uVar15 = uVar15 + 2;
            } while ((long)uVar15 < (long)uVar16);
          }
          if ((long)uVar16 < (long)uVar11) {
            do {
              *(double *)(uVar10 + uVar16 * 8) =
                   *(double *)(lVar8 + uVar16 * 8) * (double)local_1b8 +
                   *(double *)(uVar10 + uVar16 * 8);
              uVar16 = uVar16 + 1;
            } while (uVar11 != uVar16);
          }
        }
        bVar18 = false;
      }
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
    } while ((_Rb_tree_header *)p_Var12 != p_Var17);
  }
  return true;
}

Assistant:

bool OptimalControlProblem::costsFirstPartialDerivativeWRTControl(double time, const VectorDynSize &state, const VectorDynSize &control, VectorDynSize &partialDerivative)
        {
            if (partialDerivative.size() != control.size()) {
                partialDerivative.resize(control.size());
            }

            bool first = true;

            for(auto& cost : m_pimpl->costs){
                if (cost.second.timeRange.isInRange(time)){
                    if (!cost.second.cost->costFirstPartialDerivativeWRTControl(time, state, control, cost.second.controlJacobianBuffer)){
                        std::ostringstream errorMsg;
                        errorMsg << "Error while evaluating cost " << cost.second.cost->name() <<".";
                        reportError("OptimalControlProblem", "costFirstPartialDerivativeWRTControl", errorMsg.str().c_str());
                        return false;
                    }
                    if (cost.second.controlJacobianBuffer.size() != control.size()){
                        std::ostringstream errorMsg;
                        errorMsg << "Error while evaluating " << cost.second.cost->name() <<": " << "the jacobian size is expected to match the control dimension.";
                        reportError("OptimalControlProblem", "costFirstPartialDerivativeWRTControl", errorMsg.str().c_str());
                        return false;
                    }
                    if (first){
                        toEigen(partialDerivative) = cost.second.weight * toEigen(cost.second.controlJacobianBuffer);
                        first = false;
                    } else {
                        toEigen(partialDerivative) += cost.second.weight * toEigen(cost.second.controlJacobianBuffer);
                    }
                }
            }
            return true;
        }